

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
CNetAddr::GetAddrBytes(CNetAddr *this)

{
  long lVar1;
  bool bVar2;
  const_iterator __first;
  const_iterator __last;
  uint8_t (*in_RSI) [16];
  CNetAddr *in_RDI;
  long in_FS_OFFSET;
  uint8_t serialized [16];
  allocator<unsigned_char> *in_stack_ffffffffffffff68;
  CNetAddr *in_stack_ffffffffffffff70;
  allocator_type *in_stack_ffffffffffffff90;
  CNetAddr *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  uchar *in_stack_ffffffffffffffb8;
  uint8_t (*arr) [16];
  CNetAddr *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __a = in_RDI;
  arr = in_RSI;
  this_00 = in_RDI;
  bVar2 = IsAddrV1Compatible(in_stack_ffffffffffffff70);
  if (bVar2) {
    SerializeV1Array(this_00,arr);
    std::begin<unsigned_char,16ul>((uchar (*) [16])in_stack_ffffffffffffff68);
    std::end<unsigned_char,16ul>((uchar (*) [16])in_stack_ffffffffffffff68);
    std::allocator<unsigned_char>::allocator(in_stack_ffffffffffffff68);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,*in_RSI,(allocator_type *)__a);
    std::allocator<unsigned_char>::~allocator(in_stack_ffffffffffffff68);
  }
  else {
    __first = prevector<16U,_unsigned_char,_unsigned_int,_int>::begin
                        (&in_stack_ffffffffffffff70->m_addr);
    __last = prevector<16U,_unsigned_char,_unsigned_int,_int>::end
                       (&in_stack_ffffffffffffff70->m_addr);
    std::allocator<unsigned_char>::allocator(in_stack_ffffffffffffff68);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<16u,unsigned_char,unsigned_int,int>::const_iterator,void>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,__first,__last,
               in_stack_ffffffffffffff90);
    std::allocator<unsigned_char>::~allocator(in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> CNetAddr::GetAddrBytes() const
{
    if (IsAddrV1Compatible()) {
        uint8_t serialized[V1_SERIALIZATION_SIZE];
        SerializeV1Array(serialized);
        return {std::begin(serialized), std::end(serialized)};
    }
    return std::vector<unsigned char>(m_addr.begin(), m_addr.end());
}